

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::ReadSymlink(string *newName,string *origName)

{
  int iVar1;
  char *__path;
  ssize_t sVar2;
  char local_1028 [4];
  int count;
  char buf [4097];
  string *origName_local;
  string *newName_local;
  
  unique0x10000078 = origName;
  __path = (char *)std::__cxx11::string::c_str();
  sVar2 = readlink(__path,local_1028,0x1000);
  iVar1 = (int)sVar2;
  if (-1 < iVar1) {
    local_1028[iVar1] = '\0';
    std::__cxx11::string::operator=((string *)stack0xffffffffffffffe0,local_1028);
  }
  return -1 < iVar1;
}

Assistant:

bool SystemTools::ReadSymlink(const kwsys_stl::string& newName,
                              kwsys_stl::string& origName)
{
  char buf[KWSYS_SYSTEMTOOLS_MAXPATH+1];
  int count =
    static_cast<int>(readlink(newName.c_str(), buf, KWSYS_SYSTEMTOOLS_MAXPATH));
  if(count >= 0)
    {
    // Add null-terminator.
    buf[count] = 0;
    origName = buf;
    return true;
    }
  else
    {
    return false;
    }
}